

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O3

int ddGroupSifting(DdManager *table,int lower,int upper,DD_CHKFP checkFunction,int lazyFlag)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  DdSubtable *pDVar4;
  int *piVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  void *__base;
  int *piVar9;
  void *__ptr;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  code *checkFunction_00;
  long lVar16;
  int iVar17;
  
  iVar7 = table->size;
  lVar14 = (long)iVar7;
  entry = (int *)0x0;
  __size = lVar14 * 4;
  __base = malloc(__size);
  if (__base == (void *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    return 0;
  }
  piVar9 = (int *)malloc(__size);
  entry = piVar9;
  if (piVar9 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    __ptr = (void *)0x0;
  }
  else {
    __ptr = malloc(__size);
    if (__ptr != (void *)0x0) {
      if (iVar7 < 1) {
        iVar17 = 0;
      }
      else {
        pDVar4 = table->subtables;
        piVar5 = table->perm;
        lVar13 = 0;
        iVar17 = 0;
        do {
          *(undefined4 *)((long)__ptr + lVar13 * 4) = 0;
          uVar1 = piVar5[lVar13];
          if (pDVar4[(int)uVar1].next <= uVar1) {
            piVar9[lVar13] = pDVar4[(int)uVar1].keys;
            *(int *)((long)__base + (long)iVar17 * 4) = (int)lVar13;
            iVar17 = iVar17 + 1;
          }
          lVar13 = lVar13 + 1;
        } while (lVar14 != lVar13);
      }
      qsort(__base,(long)iVar17,4,ddUniqueCompareGroup);
      if (0 < iVar7 && lazyFlag != 0) {
        iVar7 = table->size;
        lVar13 = 0;
        do {
          if (lVar13 < iVar7) {
            table->subtables[table->perm[lVar13]].varHandled = 0;
          }
          lVar13 = lVar13 + 1;
        } while (lVar14 != lVar13);
      }
      iVar7 = table->siftMaxVar;
      if (iVar17 < table->siftMaxVar) {
        iVar7 = iVar17;
      }
      if (0 < iVar7) {
        lVar14 = 0;
        do {
          if (table->siftMaxSwap <= ddTotalNumberSwapping) break;
          iVar7 = *(int *)((long)__base + lVar14 * 4);
          lVar13 = (long)iVar7;
          if (*(int *)((long)__ptr + lVar13 * 4) != 1) {
            uVar1 = table->perm[lVar13];
            if (((int)uVar1 <= upper && lower <= (int)uVar1) &&
               (table->subtables[(int)uVar1].bindVar != 1)) {
              uVar2 = table->subtables[(int)uVar1].next;
              checkFunction_00 = checkFunction;
              if (uVar1 != uVar2) {
                checkFunction_00 = ddNoCheck;
              }
              iVar8 = ddGroupSiftingAux(table,uVar1,lower,upper,checkFunction_00,lazyFlag);
              if (iVar8 == 0) {
LAB_0092fdcf:
                piVar9 = entry;
                if (entry != (int *)0x0) goto LAB_0092f9b4;
                goto LAB_0092f9c7;
              }
              if ((lazyFlag == 0) && (table->groupcheck == CUDD_GROUP_CHECK7)) {
                uVar3 = table->perm[lVar13];
                lVar16 = (long)(int)uVar3;
                if (uVar3 == table->subtables[lVar16].next) {
                  bVar6 = true;
                  if ((uVar3 != upper) &&
                     (*(int *)((long)__ptr + (long)table->invperm[lVar16 + 1] * 4) == 0)) {
                    uVar12 = lVar16 + 1;
                    uVar15 = (uint)uVar12;
                    if ((uVar15 == table->subtables[uVar12].next) &&
                       (iVar8 = ddSecDiffCheck(table,uVar3,uVar15), iVar8 != 0)) {
                      pDVar4 = table->subtables;
                      do {
                        uVar10 = (uint)uVar12;
                        uVar12 = (ulong)pDVar4[(int)uVar10].next;
                      } while (uVar10 < pDVar4[(int)uVar10].next);
                      pDVar4[lVar16].next = uVar15;
                      pDVar4[(int)uVar10].next = uVar3;
                      bVar6 = false;
                    }
                  }
                  if ((uVar3 == lower) ||
                     (*(int *)((long)__ptr + (long)table->invperm[lVar16 + -1] * 4) != 0)) {
LAB_0092fc8d:
                    if (bVar6) goto LAB_0092fcd9;
                  }
                  else {
                    lVar16 = lVar16 + -1;
                    uVar15 = (uint)lVar16;
                    if ((uVar15 != table->subtables[lVar16].next) ||
                       (iVar8 = ddSecDiffCheck(table,uVar15,uVar3), iVar8 == 0)) goto LAB_0092fc8d;
                    pDVar4 = table->subtables;
                    uVar10 = uVar3;
                    do {
                      uVar11 = uVar10;
                      uVar10 = pDVar4[(int)uVar11].next;
                    } while (uVar11 < pDVar4[(int)uVar11].next);
                    pDVar4[lVar16].next = uVar3;
                    pDVar4[(int)uVar11].next = uVar15;
                  }
                  do {
                    uVar15 = uVar3;
                    uVar3 = table->subtables[(int)uVar15].next;
                  } while (uVar15 < uVar3);
                  iVar8 = ddGroupSiftingAux(table,uVar15,lower,upper,ddNoCheck,0);
                  if (iVar8 == 0) goto LAB_0092fdcf;
                }
              }
LAB_0092fcd9:
              pDVar4 = table->subtables;
              piVar9 = table->perm;
              uVar3 = piVar9[lVar13];
              if (uVar3 != pDVar4[(int)uVar3].next) {
                piVar5 = table->invperm;
                uVar15 = uVar3;
                do {
                  *(undefined4 *)((long)__ptr + (long)piVar5[(int)uVar15] * 4) = 1;
                  uVar15 = pDVar4[(int)uVar15].next;
                } while (uVar15 != uVar3);
                if ((lazyFlag == 0) && (uVar15 = uVar3, uVar1 == uVar2)) {
                  do {
                    uVar1 = pDVar4[(int)uVar15].next;
                    pDVar4[(int)uVar15].next = uVar15;
                    uVar15 = uVar1;
                  } while (uVar1 != uVar3);
                }
              }
              if (((lazyFlag != 0) && (-1 < iVar7)) && (iVar7 < table->size)) {
                pDVar4[piVar9[lVar13]].varHandled = 1;
              }
            }
          }
          lVar14 = lVar14 + 1;
          iVar7 = table->siftMaxVar;
          if (iVar17 < table->siftMaxVar) {
            iVar7 = iVar17;
          }
        } while (lVar14 < iVar7);
      }
      free(__ptr);
      free(__base);
      if (entry == (int *)0x0) {
        return 1;
      }
      free(entry);
      entry = (int *)0x0;
      return 1;
    }
    table->errorCode = CUDD_MEMORY_OUT;
LAB_0092f9b4:
    free(piVar9);
    entry = (int *)0x0;
LAB_0092f9c7:
    if (__base == (void *)0x0) goto LAB_0092f9d6;
  }
  free(__base);
LAB_0092f9d6:
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return 0;
}

Assistant:

static int
ddGroupSifting(
  DdManager * table,
  int  lower,
  int  upper,
  DD_CHKFP checkFunction,
  int lazyFlag)
{
    int         *var;
    int         i,j,x,xInit;
    int         nvars;
    int         classes;
    int         result;
    int         *sifted;
    int         merged;
    int         dissolve;
#ifdef DD_STATS
    unsigned    previousSize;
#endif
    int         xindex;

    nvars = table->size;

    /* Order variables to sift. */
    entry = NULL;
    sifted = NULL;
    var = ABC_ALLOC(int,nvars);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddGroupSiftingOutOfMem;
    }
    entry = ABC_ALLOC(int,nvars);
    if (entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddGroupSiftingOutOfMem;
    }
    sifted = ABC_ALLOC(int,nvars);
    if (sifted == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddGroupSiftingOutOfMem;
    }

    /* Here we consider only one representative for each group. */
    for (i = 0, classes = 0; i < nvars; i++) {
        sifted[i] = 0;
        x = table->perm[i];
        if ((unsigned) x >= table->subtables[x].next) {
            entry[i] = table->subtables[x].keys;
            var[classes] = i;
            classes++;
        }
    }

    qsort((void *)var,(size_t)classes,sizeof(int),
          (DD_QSFP) ddUniqueCompareGroup);

    if (lazyFlag) {
        for (i = 0; i < nvars; i ++) {
            ddResetVarHandled(table, i);
        }
    }

    /* Now sift. */
    for (i = 0; i < ddMin(table->siftMaxVar,classes); i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        xindex = var[i];
        if (sifted[xindex] == 1) /* variable already sifted as part of group */
            continue;
        x = table->perm[xindex]; /* find current level of this variable */

        if (x < lower || x > upper || table->subtables[x].bindVar == 1)
            continue;
#ifdef DD_STATS
        previousSize = table->keys - table->isolated;
#endif
#ifdef DD_DEBUG
        /* x is bottom of group */
        assert((unsigned) x >= table->subtables[x].next);
#endif
        if ((unsigned) x == table->subtables[x].next) {
            dissolve = 1;
            result = ddGroupSiftingAux(table,x,lower,upper,checkFunction,
                                        lazyFlag);
        } else {
            dissolve = 0;
            result = ddGroupSiftingAux(table,x,lower,upper,ddNoCheck,lazyFlag);
        }
        if (!result) goto ddGroupSiftingOutOfMem;

        /* check for aggregation */
        merged = 0;
        if (lazyFlag == 0 && table->groupcheck == CUDD_GROUP_CHECK7) {
            x = table->perm[xindex]; /* find current level */
            if ((unsigned) x == table->subtables[x].next) { /* not part of a group */
                if (x != upper && sifted[table->invperm[x+1]] == 0 &&
                (unsigned) x+1 == table->subtables[x+1].next) {
                    if (ddSecDiffCheck(table,x,x+1)) {
                        merged =1;
                        ddCreateGroup(table,x,x+1);
                    }
                }
                if (x != lower && sifted[table->invperm[x-1]] == 0 &&
                (unsigned) x-1 == table->subtables[x-1].next) {
                    if (ddSecDiffCheck(table,x-1,x)) {
                        merged =1;
                        ddCreateGroup(table,x-1,x);
                    }
                }
            }
        }

        if (merged) { /* a group was created */
            /* move x to bottom of group */
            while ((unsigned) x < table->subtables[x].next)
                x = table->subtables[x].next;
            /* sift */
            result = ddGroupSiftingAux(table,x,lower,upper,ddNoCheck,lazyFlag);
            if (!result) goto ddGroupSiftingOutOfMem;
#ifdef DD_STATS
            if (table->keys < previousSize + table->isolated) {
                (void) fprintf(table->out,"_");
            } else if (table->keys > previousSize + table->isolated) {
                (void) fprintf(table->out,"^");
            } else {
                (void) fprintf(table->out,"*");
            }
            fflush(table->out);
        } else {
            if (table->keys < previousSize + table->isolated) {
                (void) fprintf(table->out,"-");
            } else if (table->keys > previousSize + table->isolated) {
                (void) fprintf(table->out,"+");
            } else {
                (void) fprintf(table->out,"=");
            }
            fflush(table->out);
#endif
        }

        /* Mark variables in the group just sifted. */
        x = table->perm[xindex];
        if ((unsigned) x != table->subtables[x].next) {
            xInit = x;
            do {
                j = table->invperm[x];
                sifted[j] = 1;
                x = table->subtables[x].next;
            } while (x != xInit);

            /* Dissolve the group if it was created. */
            if (lazyFlag == 0 && dissolve) {
                do {
                    j = table->subtables[x].next;
                    table->subtables[x].next = x;
                    x = j;
                } while (x != xInit);
            }
        }

#ifdef DD_DEBUG
        if (pr > 0) (void) fprintf(table->out,"ddGroupSifting:");
#endif

      if (lazyFlag) ddSetVarHandled(table, xindex);
    } /* for */

    ABC_FREE(sifted);
    ABC_FREE(var);
    ABC_FREE(entry);

    return(1);

ddGroupSiftingOutOfMem:
    if (entry != NULL)  ABC_FREE(entry);
    if (var != NULL)    ABC_FREE(var);
    if (sifted != NULL) ABC_FREE(sifted);

    return(0);

}